

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStack.cpp
# Opt level: O0

void __thiscall JSON::JSONStack::Pop(JSONStack *this,bool bJsObject)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool bJsObject_local;
  JSONStack *this_local;
  
  if (bJsObject) {
    if (this->tempValues[0] == (Var)0x0) {
      SList<void_*,_Memory::ArenaAllocator,_RealCount>::Pop(&this->jsObjectStack);
    }
    else {
      this->tempValues[0] = (Var)0x0;
    }
  }
  else {
    if (this->domObjectStack == (DOMObjectStack *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStack.cpp"
                         ,0x71,"(domObjectStack != __null)","Misaligned pop");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (this->tempValues[1] == (Var)0x0) {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::RemoveAtEnd(this->domObjectStack);
    }
    else {
      this->tempValues[1] = (Var)0x0;
    }
  }
  return;
}

Assistant:

void JSONStack::Pop(bool bJsObject)
    {
        if (bJsObject)
        {
            if (_JS_VALUE)
            {
                _JS_VALUE = nullptr;
            }
            else
            {
                jsObjectStack.Pop();
            }
            return;
        }
        AssertMsg(domObjectStack != NULL, "Misaligned pop");

        if (_DOM_VALUE)
        {
            _DOM_VALUE = nullptr;
        }
        else
        {
            domObjectStack->RemoveAtEnd();
        }
    }